

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

SplitTxOutRequestStruct * __thiscall
cfd::js::api::json::SplitTxOutRequest::ConvertToStruct
          (SplitTxOutRequestStruct *__return_storage_ptr__,SplitTxOutRequest *this)

{
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>
  local_48;
  undefined1 local_19;
  SplitTxOutRequest *local_18;
  SplitTxOutRequest *this_local;
  SplitTxOutRequestStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (SplitTxOutRequest *)__return_storage_ptr__;
  SplitTxOutRequestStruct::SplitTxOutRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->tx_);
  __return_storage_ptr__->is_elements = (bool)(this->is_elements_ & 1);
  __return_storage_ptr__->index = this->index_;
  core::JsonObjectVector<cfd::js::api::json::SplitTxOutData,_cfd::js::api::SplitTxOutDataStruct>::
  ConvertToStruct(&local_48,&this->txouts_);
  std::
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>::
  operator=(&__return_storage_ptr__->txouts,&local_48);
  std::
  vector<cfd::js::api::SplitTxOutDataStruct,_std::allocator<cfd::js::api::SplitTxOutDataStruct>_>::
  ~vector(&local_48);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

SplitTxOutRequestStruct SplitTxOutRequest::ConvertToStruct() const {  // NOLINT
  SplitTxOutRequestStruct result;
  result.tx = tx_;
  result.is_elements = is_elements_;
  result.index = index_;
  result.txouts = txouts_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}